

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O0

void __thiscall
TEST_UnitTestMacros_SuccessPrintsNothing_Test::testBody
          (TEST_UnitTestMacros_SuccessPrintsNothing_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  size_t sVar3;
  TestTerminator *pTVar4;
  SimpleString local_20;
  TEST_UnitTestMacros_SuccessPrintsNothing_Test *local_10;
  TEST_UnitTestMacros_SuccessPrintsNothing_Test *this_local;
  
  local_10 = this;
  TestTestingFixture::runTestWithMethod
            (&(this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture,passingTestMethod_);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = TestTestingFixture::getFailureCount
                    (&(this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,sVar3,"LONGS_EQUAL(0, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x3a9,pTVar4);
  SimpleString::SimpleString(&local_20,".\nOK (1 tests");
  TestTestingFixture::assertPrintContains
            (&(this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture,&local_20);
  SimpleString::~SimpleString(&local_20);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = lineOfCodeExecutedAfterCheck;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(bVar1 & 1),"CHECK","lineOfCodeExecutedAfterCheck",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x3ab,pTVar4);
  return;
}

Assistant:

TEST(UnitTestMacros, SuccessPrintsNothing)
{
    fixture.runTestWithMethod(passingTestMethod_);

    LONGS_EQUAL(0, fixture.getFailureCount());
    fixture.assertPrintContains(".\nOK (1 tests");
    CHECK(lineOfCodeExecutedAfterCheck);
}